

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O3

void compile_ref_matchingpath
               (compiler_common *common,PCRE2_SPTR16 cc,jump_list **backtracks,BOOL withchecks,
               BOOL emptyfail)

{
  ushort uVar1;
  int iVar2;
  sljit_compiler *compiler;
  sljit_u8 *psVar3;
  sljit_jump *psVar4;
  jump_list *pjVar5;
  sljit_jump *psVar6;
  sljit_jump *psVar7;
  jump_list **ppjVar8;
  sljit_jump *psVar9;
  sljit_label *psVar10;
  sljit_s32 src1;
  sljit_sw src1w;
  
  compiler = common->compiler;
  if ((ushort)(*cc - 0x71) < 2) {
    uVar1 = cc[1];
    if (compiler->error == 0) {
      iVar2 = common->ovector_start;
      compiler->mode32 = 0;
      psVar3 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar2 + (ulong)uVar1 * 0x10);
      if (psVar3 != (sljit_u8 *)0x0) {
        *psVar3 = 0x8b;
      }
    }
    if ((withchecks == 0) || (common->unset_backref != 0)) {
LAB_00113bc2:
      if (compiler->error == 0) {
        src1w = (long)common->ovector_start + (ulong)uVar1 * 0x10 + 8;
        compiler->mode32 = 0;
        src1 = 0x8e;
LAB_00113c64:
        emit_non_cum_binary(compiler,0x2d2b2928,4,0,src1,src1w,1,0);
      }
      goto LAB_00113c69;
    }
    psVar4 = sljit_emit_cmp(compiler,0,1,0,0x8e,(long)common->ovector_start + 8);
    if (compiler->error == 0) {
      pjVar5 = (jump_list *)ensure_abuf(compiler,0x10);
      if (pjVar5 != (jump_list *)0x0) {
        pjVar5->next = *backtracks;
        pjVar5->jump = psVar4;
        *backtracks = pjVar5;
      }
      goto LAB_00113bc2;
    }
  }
  else {
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar3 = emit_x86_instruction(compiler,1,1,0,0x84,0);
      if (psVar3 != (sljit_u8 *)0x0) {
        *psVar3 = 0x8b;
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        src1w = 8;
        src1 = 0x84;
        goto LAB_00113c64;
      }
    }
LAB_00113c69:
    if (withchecks == 0) {
      psVar4 = (sljit_jump *)0x0;
      goto LAB_00113c80;
    }
  }
  psVar4 = sljit_emit_jump(compiler,0);
LAB_00113c80:
  sljit_emit_op2(compiler,0x60,2,0,2,0,4,0);
  psVar6 = sljit_emit_cmp(compiler,4,2,0,0xd,0);
  if ((common->mode == 1) && (compiler->error == 0)) {
    pjVar5 = (jump_list *)ensure_abuf(compiler,0x10);
    if (pjVar5 != (jump_list *)0x0) {
      pjVar5->next = *backtracks;
      pjVar5->jump = psVar6;
      *backtracks = pjVar5;
    }
  }
  ppjVar8 = &common->caselesscmp;
  if (*cc == 0x71) {
    ppjVar8 = &common->casefulcmp;
  }
  psVar7 = sljit_emit_jump(compiler,0x19);
  if (compiler->error == 0) {
    pjVar5 = (jump_list *)ensure_abuf(compiler,0x10);
    if (pjVar5 != (jump_list *)0x0) {
      pjVar5->next = *ppjVar8;
      pjVar5->jump = psVar7;
      *ppjVar8 = pjVar5;
    }
  }
  psVar7 = sljit_emit_cmp(compiler,1,4,0,0x40,0);
  if (compiler->error == 0) {
    pjVar5 = (jump_list *)ensure_abuf(compiler,0x10);
    if (pjVar5 != (jump_list *)0x0) {
      pjVar5->next = *backtracks;
      pjVar5->jump = psVar7;
      *backtracks = pjVar5;
    }
  }
  if (common->mode != 1) {
    psVar7 = sljit_emit_jump(compiler,0x18);
    psVar10 = sljit_emit_label(compiler);
    if ((psVar6 != (sljit_jump *)0x0) && (psVar10 != (sljit_label *)0x0)) {
      psVar6->flags = (psVar6->flags & 0xfffffffffffffffcU) + 1;
      (psVar6->u).label = psVar10;
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar3 = emit_x86_instruction(compiler,1,4,0,2,0);
      if (psVar3 != (sljit_u8 *)0x0) {
        *psVar3 = '+';
      }
    }
    sljit_emit_op2(compiler,0x60,4,0,4,0,0xd,0);
    psVar6 = sljit_emit_cmp(compiler,0,4,0,0x40,0);
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar3 = emit_x86_instruction(compiler,1,0xd,0,2,0);
      if (psVar3 != (sljit_u8 *)0x0) {
        *psVar3 = 0x89;
      }
    }
    ppjVar8 = &common->caselesscmp;
    if (*cc == 0x71) {
      ppjVar8 = &common->casefulcmp;
    }
    psVar9 = sljit_emit_jump(compiler,0x19);
    if (compiler->error == 0) {
      pjVar5 = (jump_list *)ensure_abuf(compiler,0x10);
      if (pjVar5 != (jump_list *)0x0) {
        pjVar5->next = *ppjVar8;
        pjVar5->jump = psVar9;
        *ppjVar8 = pjVar5;
      }
    }
    psVar9 = sljit_emit_cmp(compiler,1,4,0,0x40,0);
    if (compiler->error == 0) {
      pjVar5 = (jump_list *)ensure_abuf(compiler,0x10);
      if (pjVar5 != (jump_list *)0x0) {
        pjVar5->next = *backtracks;
        pjVar5->jump = psVar9;
        *backtracks = pjVar5;
      }
    }
    psVar10 = sljit_emit_label(compiler);
    if ((psVar6 != (sljit_jump *)0x0) && (psVar10 != (sljit_label *)0x0)) {
      psVar6->flags = (psVar6->flags & 0xfffffffffffffffcU) + 1;
      (psVar6->u).label = psVar10;
    }
    check_partial(common,0);
    psVar6 = sljit_emit_jump(compiler,0x18);
    if (compiler->error == 0) {
      pjVar5 = (jump_list *)ensure_abuf(compiler,0x10);
      if (pjVar5 != (jump_list *)0x0) {
        pjVar5->next = *backtracks;
        pjVar5->jump = psVar6;
        *backtracks = pjVar5;
      }
    }
    psVar10 = sljit_emit_label(compiler);
    if ((psVar7 != (sljit_jump *)0x0) && (psVar10 != (sljit_label *)0x0)) {
      psVar7->flags = (psVar7->flags & 0xfffffffffffffffcU) + 1;
      (psVar7->u).label = psVar10;
    }
  }
  if (psVar4 != (sljit_jump *)0x0) {
    if (emptyfail == 0) {
      psVar10 = sljit_emit_label(compiler);
      if (psVar10 != (sljit_label *)0x0) {
        psVar4->flags = (psVar4->flags & 0xfffffffffffffffcU) + 1;
        (psVar4->u).label = psVar10;
      }
    }
    else if (compiler->error == 0) {
      pjVar5 = (jump_list *)ensure_abuf(compiler,0x10);
      if (pjVar5 != (jump_list *)0x0) {
        pjVar5->next = *backtracks;
        pjVar5->jump = psVar4;
        *backtracks = pjVar5;
      }
    }
  }
  return;
}

Assistant:

static void compile_ref_matchingpath(compiler_common *common, PCRE2_SPTR cc, jump_list **backtracks, BOOL withchecks, BOOL emptyfail)
{
DEFINE_COMPILER;
BOOL ref = (*cc == OP_REF || *cc == OP_REFI);
int offset = 0;
struct sljit_jump *jump = NULL;
struct sljit_jump *partial;
struct sljit_jump *nopartial;

if (ref)
  {
  offset = GET2(cc, 1) << 1;
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
  /* OVECTOR(1) contains the "string begin - 1" constant. */
  if (withchecks && !common->unset_backref)
    add_jump(compiler, backtracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1)));
  }
else
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);

#if defined SUPPORT_UNICODE
if (common->utf && *cc == OP_REFI)
  {
  SLJIT_ASSERT(TMP1 == SLJIT_R0 && STR_PTR == SLJIT_R1);
  if (ref)
    OP1(SLJIT_MOV, SLJIT_R2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
  else
    OP1(SLJIT_MOV, SLJIT_R2, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));

  if (withchecks)
    jump = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_R2, 0);
  /* No free saved registers so save data on stack. */

  OP1(SLJIT_MOV, SLJIT_R3, 0, STR_END, 0);
  sljit_emit_icall(compiler, SLJIT_CALL, SLJIT_RET(SW) | SLJIT_ARG1(SW) | SLJIT_ARG2(SW) | SLJIT_ARG3(SW) | SLJIT_ARG4(SW), SLJIT_IMM, SLJIT_FUNC_OFFSET(do_utf_caselesscmp));
  OP1(SLJIT_MOV, STR_PTR, 0, SLJIT_RETURN_REG, 0);

  if (common->mode == PCRE2_JIT_COMPLETE)
    add_jump(compiler, backtracks, CMP(SLJIT_LESS_EQUAL, SLJIT_RETURN_REG, 0, SLJIT_IMM, 1));
  else
    {
    OP2(SLJIT_SUB | SLJIT_SET_Z | SLJIT_SET_LESS, SLJIT_UNUSED, 0, SLJIT_RETURN_REG, 0, SLJIT_IMM, 1);

    add_jump(compiler, backtracks, JUMP(SLJIT_LESS));

    nopartial = JUMP(SLJIT_NOT_EQUAL);
    OP1(SLJIT_MOV, STR_PTR, 0, STR_END, 0);
    check_partial(common, FALSE);
    add_jump(compiler, backtracks, JUMP(SLJIT_JUMP));
    JUMPHERE(nopartial);
    }
  }
else
#endif /* SUPPORT_UNICODE */
  {
  if (ref)
    OP2(SLJIT_SUB | SLJIT_SET_Z, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1), TMP1, 0);
  else
    OP2(SLJIT_SUB | SLJIT_SET_Z, TMP2, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw), TMP1, 0);

  if (withchecks)
    jump = JUMP(SLJIT_ZERO);

  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, TMP2, 0);
  partial = CMP(SLJIT_GREATER, STR_PTR, 0, STR_END, 0);
  if (common->mode == PCRE2_JIT_COMPLETE)
    add_jump(compiler, backtracks, partial);

  add_jump(compiler, *cc == OP_REF ? &common->casefulcmp : &common->caselesscmp, JUMP(SLJIT_FAST_CALL));
  add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP2, 0, SLJIT_IMM, 0));

  if (common->mode != PCRE2_JIT_COMPLETE)
    {
    nopartial = JUMP(SLJIT_JUMP);
    JUMPHERE(partial);
    /* TMP2 -= STR_END - STR_PTR */
    OP2(SLJIT_SUB, TMP2, 0, TMP2, 0, STR_PTR, 0);
    OP2(SLJIT_ADD, TMP2, 0, TMP2, 0, STR_END, 0);
    partial = CMP(SLJIT_EQUAL, TMP2, 0, SLJIT_IMM, 0);
    OP1(SLJIT_MOV, STR_PTR, 0, STR_END, 0);
    add_jump(compiler, *cc == OP_REF ? &common->casefulcmp : &common->caselesscmp, JUMP(SLJIT_FAST_CALL));
    add_jump(compiler, backtracks, CMP(SLJIT_NOT_EQUAL, TMP2, 0, SLJIT_IMM, 0));
    JUMPHERE(partial);
    check_partial(common, FALSE);
    add_jump(compiler, backtracks, JUMP(SLJIT_JUMP));
    JUMPHERE(nopartial);
    }
  }

if (jump != NULL)
  {
  if (emptyfail)
    add_jump(compiler, backtracks, jump);
  else
    JUMPHERE(jump);
  }
}